

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O0

uint lodepng_decode_file(uchar **out,uint *w,uint *h,char *filename,LodePNGColorType colortype,
                        uint bitdepth)

{
  undefined4 *in_RDX;
  undefined4 *in_RSI;
  undefined8 *in_RDI;
  undefined4 in_R8D;
  undefined4 in_R9D;
  uint error;
  size_t buffersize;
  uchar *buffer;
  LodePNGColorType in_stack_0000023c;
  size_t in_stack_00000240;
  uchar *in_stack_00000248;
  uint *in_stack_00000250;
  uint *in_stack_00000258;
  uchar **in_stack_00000260;
  uint in_stack_00000270;
  undefined4 local_3c;
  char *in_stack_ffffffffffffffc8;
  
  *in_RDI = 0;
  *in_RDX = 0;
  *in_RSI = 0;
  local_3c = lodepng_load_file((uchar **)CONCAT44(in_R8D,in_R9D),(size_t *)0x0,
                               in_stack_ffffffffffffffc8);
  if (local_3c == 0) {
    local_3c = lodepng_decode_memory
                         (in_stack_00000260,in_stack_00000258,in_stack_00000250,in_stack_00000248,
                          in_stack_00000240,in_stack_0000023c,in_stack_00000270);
  }
  lodepng_free((void *)0x1c7fc4);
  return local_3c;
}

Assistant:

unsigned lodepng_decode_file(unsigned char** out, unsigned* w, unsigned* h, const char* filename,
                             LodePNGColorType colortype, unsigned bitdepth) {
  unsigned char* buffer = 0;
  size_t buffersize;
  unsigned error;
  /* safe output values in case error happens */
  *out = 0;
  *w = *h = 0;
  error = lodepng_load_file(&buffer, &buffersize, filename);
  if(!error) error = lodepng_decode_memory(out, w, h, buffer, buffersize, colortype, bitdepth);
  lodepng_free(buffer);
  return error;
}